

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t fmovem_postinc(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask,
                       float_access access_fn)

{
  int iVar1;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  for (lVar2 = 0x70; lVar2 != 0xf0; lVar2 = lVar2 + 0x10) {
    if ((char)mask < '\0') {
      iVar1 = (*access_fn)(env,addr,(FPReg_conflict *)((long)env->dregs + lVar2),unaff_retaddr);
      addr = addr + iVar1;
    }
    mask = mask * 2;
  }
  return addr;
}

Assistant:

static uint32_t fmovem_postinc(CPUM68KState *env, uint32_t addr, uint32_t mask,
                               float_access access_fn)
{
    uintptr_t ra = GETPC();
    int i, size;

    for (i = 0; i < 8; i++, mask <<= 1) {
        if (mask & 0x80) {
            size = access_fn(env, addr, &env->fregs[i], ra);
            addr += size;
        }
    }

    return addr;
}